

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_entry.h
# Opt level: O2

void __thiscall
NewMempoolTransactionInfo::NewMempoolTransactionInfo
          (NewMempoolTransactionInfo *this,CTransactionRef *tx,CAmount *fee,int64_t vsize,
          uint height,bool mempool_limit_bypassed,bool submitted_in_package,
          bool chainstate_is_current,bool has_no_mempool_parents)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TransactionInfo::TransactionInfo(&this->info,tx,fee,vsize,height);
  this->m_mempool_limit_bypassed = mempool_limit_bypassed;
  this->m_submitted_in_package = submitted_in_package;
  this->m_chainstate_is_current = chainstate_is_current;
  this->m_has_no_mempool_parents = has_no_mempool_parents;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit NewMempoolTransactionInfo(const CTransactionRef& tx, const CAmount& fee,
                                       const int64_t vsize, const unsigned int height,
                                       const bool mempool_limit_bypassed, const bool submitted_in_package,
                                       const bool chainstate_is_current,
                                       const bool has_no_mempool_parents)
        : info{tx, fee, vsize, height},
          m_mempool_limit_bypassed{mempool_limit_bypassed},
          m_submitted_in_package{submitted_in_package},
          m_chainstate_is_current{chainstate_is_current},
          m_has_no_mempool_parents{has_no_mempool_parents} {}